

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O3

QVariant * QVariant::moveConstruct(QVariant *__return_storage_ptr__,QMetaType type,void *data)

{
  undefined1 *puVar1;
  ushort uVar2;
  uint uVar3;
  PrivateShared *pPVar4;
  ulong uVar5;
  void *__dest;
  int iVar6;
  
  (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
  *(ulong *)&(__return_storage_ptr__->d).field_0x18 = (ulong)type.d_ptr & 0xfffffffffffffffc;
  if (data == (void *)0x0) {
    uVar5 = 2;
  }
  else {
    uVar5 = (ulong)((uint)(((type.d_ptr)->typeId)._q_value.super___atomic_base<int>._M_i == 0x33) *
                   2);
  }
  *(ulong *)&(__return_storage_ptr__->d).field_0x18 = uVar5 | (ulong)type.d_ptr & 0xfffffffffffffffc
  ;
  uVar3 = (type.d_ptr)->size;
  uVar2 = (type.d_ptr)->alignment;
  if (((uVar2 < 9 && uVar3 < 0x19) & ((byte)(type.d_ptr)->flags & 4) >> 2) != 1) {
    uVar5 = 8;
    if (8 < (ulong)uVar2) {
      uVar5 = (ulong)uVar2;
    }
    pPVar4 = (PrivateShared *)operator_new(uVar5 + uVar3);
    (pPVar4->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int> = (__atomic_base<int>)0x1;
    iVar6 = (-(uint)uVar2 & (int)pPVar4 + (uint)uVar2 + 7) - (int)pPVar4;
    pPVar4->offset = iVar6;
    __dest = (void *)((long)&(pPVar4->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
                             _q_value.super___atomic_base<int> + (long)iVar6);
    if ((type.d_ptr)->moveCtr == (MoveCtrFn)0x0) {
      memcpy(__dest,data,(ulong)(type.d_ptr)->size);
    }
    else {
      (*(type.d_ptr)->moveCtr)(type.d_ptr,__dest,data);
    }
    (__return_storage_ptr__->d).data.shared = pPVar4;
    puVar1 = &(__return_storage_ptr__->d).field_0x18;
    *puVar1 = *puVar1 | 1;
    return __return_storage_ptr__;
  }
  if (data == (void *)0x0) {
    if ((type.d_ptr)->defaultCtr == (DefaultCtrFn)0x0) {
      return __return_storage_ptr__;
    }
    if ((type.d_ptr)->moveCtr != (MoveCtrFn)0x0) {
      (*(type.d_ptr)->moveCtr)(type.d_ptr,__return_storage_ptr__,(void *)0x0);
      return __return_storage_ptr__;
    }
    data = (void *)0x0;
  }
  else if ((type.d_ptr)->moveCtr != (MoveCtrFn)0x0) {
    (*(type.d_ptr)->moveCtr)(type.d_ptr,__return_storage_ptr__,data);
    return __return_storage_ptr__;
  }
  __memcpy_chk(__return_storage_ptr__,data,(ulong)uVar3,0x20);
  return __return_storage_ptr__;
}

Assistant:

QVariant QVariant::moveConstruct(QMetaType type, void *data)
{
    QVariant var;
    var.d = QVariant::Private(type.d_ptr);
    customConstruct<ForceMove, NonNull>(type.d_ptr, &var.d, data);
    return var;
}